

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  uint uVar1;
  XXH64_state_t *code;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long_long uVar5;
  undefined8 in_RCX;
  U64 in_RDX;
  ZSTD_CCtx_params *in_RSI;
  size_t in_RDI;
  long in_stack_00000008;
  U32 checksum;
  size_t err_code_1;
  size_t err_code;
  size_t frameHeaderSize;
  size_t compressedBlocksSize;
  size_t cSize;
  BYTE *op;
  void *in_stack_00000070;
  ZSTD_CCtx *in_stack_00000078;
  size_t in_stack_00000090;
  size_t in_stack_000000d8;
  ZSTD_EndDirective in_stack_000000e4;
  ZSTD_CCtx *in_stack_000000e8;
  size_t in_stack_00000110;
  void *in_stack_00000118;
  XXH64_state_t *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff90;
  long lVar6;
  XXH64_state_t *state_in;
  U32 UVar7;
  void *in_stack_fffffffffffffff8;
  
  UVar7 = (U32)((ulong)in_RCX >> 0x20);
  lVar6 = 0;
  code = (XXH64_state_t *)
         ZSTD_CCtx_init_compressStream2(in_stack_000000e8,in_stack_000000e4,in_stack_000000d8);
  uVar1 = ERR_isError((size_t)code);
  if (uVar1 == 0) {
    sVar2 = ZSTD_writeFrameHeader(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,UVar7);
    lVar3 = in_RDX - sVar2;
    lVar6 = sVar2 + lVar6;
    if ((*(int *)(in_RDI + 0x10c) != 0) && (in_stack_00000008 != 0)) {
      XXH64_update(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    }
    code = (XXH64_state_t *)
           ZSTD_compressSequences_internal
                     (in_stack_00000078,in_stack_00000070,(size_t)cctx,(ZSTD_Sequence *)dst,
                      dstCapacity,inSeqs,in_stack_00000090);
    UVar7 = (U32)((ulong)in_stack_00000008 >> 0x20);
    uVar1 = ERR_isError((size_t)code);
    if (uVar1 == 0) {
      state_in = (XXH64_state_t *)((long)code->mem64 + lVar6 + -0x28);
      uVar4 = lVar3 - (long)code;
      code = state_in;
      if (*(int *)(in_RDI + 0x10c) != 0) {
        uVar5 = XXH64_digest(state_in);
        if (uVar4 < 4) {
          code = (XXH64_state_t *)0xffffffffffffffba;
        }
        else {
          MEM_writeLE32((void *)CONCAT44((int)uVar5,in_stack_ffffffffffffff90),UVar7);
          code = (XXH64_state_t *)((long)&state_in->total_len + 4);
        }
      }
    }
  }
  return (size_t)code;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}